

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.c
# Opt level: O0

void search_tests(char *name,test **matched,int *n)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  int local_28;
  int local_24;
  int i;
  int j;
  int *n_local;
  test **matched_local;
  char *name_local;
  
  local_24 = 0;
  local_28 = 0;
  do {
    if (test_count <= local_28) {
      *n = local_24;
      return;
    }
    pcVar1 = tests[local_28].suite;
    sVar3 = strlen(tests[local_28].suite);
    iVar2 = strncmp(name,pcVar1,sVar3);
    if (iVar2 == 0) {
LAB_0010270f:
      matched[local_24] = tests + local_28;
      local_24 = local_24 + 1;
    }
    else {
      pcVar1 = tests[local_28].name;
      sVar3 = strlen(tests[local_28].name);
      iVar2 = strncmp(name,pcVar1,sVar3);
      if (iVar2 == 0) goto LAB_0010270f;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

void search_tests(const char *name, struct test **matched, int *n){
  int j = 0;
  for(int i=0; i<test_count; ++i){
    if(strncmp(name, tests[i].suite, strlen(tests[i].suite)) == 0
       || strncmp(name, tests[i].name, strlen(tests[i].name)) == 0)
      matched[j++] = &tests[i];
  }
  *n = j;
}